

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ReadCompressedBuffer
          (ON_BinaryArchive *this,size_t sizeof__outbuffer,void *outbuffer,bool *bFailedCRC)

{
  bool bVar1;
  char local_3d;
  ON__UINT32 local_3c;
  ON__UINT32 OStack_38;
  char method;
  uint buffer_crc1;
  uint buffer_crc0;
  bool rc;
  bool *bFailedCRC_local;
  void *outbuffer_local;
  size_t sizeof__outbuffer_local;
  ON_BinaryArchive *this_local;
  
  buffer_crc1._3_1_ = 0;
  OStack_38 = 0;
  local_3c = 0;
  local_3d = '\0';
  if (bFailedCRC != (bool *)0x0) {
    *bFailedCRC = false;
  }
  _buffer_crc0 = bFailedCRC;
  bFailedCRC_local = (bool *)outbuffer;
  outbuffer_local = (void *)sizeof__outbuffer;
  sizeof__outbuffer_local = (size_t)this;
  bVar1 = ReadMode(this);
  if (bVar1) {
    if (outbuffer_local == (void *)0x0) {
      this_local._7_1_ = true;
    }
    else if (bFailedCRC_local == (bool *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = ReadInt(this,&stack0xffffffffffffffc8);
      if (bVar1) {
        bVar1 = ReadChar(this,&local_3d);
        if (bVar1) {
          if ((local_3d == '\0') || (local_3d == '\x01')) {
            if (local_3d == '\0') {
              buffer_crc1._3_1_ = ReadByte(this,(size_t)outbuffer_local,bFailedCRC_local);
            }
            else if (local_3d == '\x01') {
              buffer_crc1._3_1_ = CompressionInit(this);
              if ((bool)buffer_crc1._3_1_) {
                buffer_crc1._3_1_ = ReadInflate(this,(size_t)outbuffer_local,bFailedCRC_local);
              }
              CompressionEnd(this);
            }
            if ((((buffer_crc1._3_1_ & 1) != 0) &&
                (local_3c = ON_CRC32(0,(size_t)outbuffer_local,bFailedCRC_local),
                local_3c != OStack_38)) &&
               (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_zlib.cpp"
                           ,0xd1,"","ON_BinaryArchive::ReadCompressedBuffer() crc error"),
               _buffer_crc0 != (bool *)0x0)) {
              *_buffer_crc0 = true;
            }
            this_local._7_1_ = (bool)(buffer_crc1._3_1_ & 1);
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::ReadCompressedBuffer( // read and uncompress
  size_t sizeof__outbuffer,  // sizeof of uncompressed buffer to read
  void* outbuffer,           // uncompressed output data returned here
  bool* bFailedCRC
  )
{
  bool rc = false;
  unsigned int buffer_crc0 = 0;
  unsigned int buffer_crc1 = 0;
  char method = 0;

  if ( bFailedCRC)
    *bFailedCRC = false;
  if ( !ReadMode() )
    return false;
  if ( 0 == sizeof__outbuffer )
    return true;
  if ( 0 == outbuffer )
    return false;

  if ( !ReadInt(&buffer_crc0) ) // 32 bit crc of uncompressed buffer
    return false;

  if ( !ReadChar(&method) )
    return false;

  if ( method != 0 && method != 1 )
    return false;

  switch(method)
  {
  case 0: // uncompressed
    rc = ReadByte(sizeof__outbuffer, outbuffer);
    break;
  case 1: // compressed
    rc = CompressionInit();
    if (rc)
      rc = ReadInflate( sizeof__outbuffer, outbuffer );
    CompressionEnd();
    break;
  }

  if (rc ) 
  {
    buffer_crc1 = ON_CRC32( 0, sizeof__outbuffer, outbuffer );
    if ( buffer_crc1 != buffer_crc0 ) 
    {
      ON_ERROR("ON_BinaryArchive::ReadCompressedBuffer() crc error");
      if ( bFailedCRC )
        *bFailedCRC = true;
    }
  }

  return rc;
}